

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::Data
          (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *this,
          Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  Node<QByteArray,_QByteArray> *pNVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  R RVar10;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar7 = other->numBuckets;
  sVar8 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar8;
  this->spans = (Span *)0x0;
  RVar10 = allocateSpans(sVar7);
  this->spans = (Span *)RVar10.spans;
  if (RVar10.nSpans != 0) {
    lVar6 = 0;
    sVar7 = 0;
    do {
      pSVar2 = other->spans;
      sVar8 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar8 + lVar6];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar7].entries;
          uVar9 = (ulong)((uint)bVar1 * 0x30);
          pNVar5 = Span<QHashPrivate::Node<QByteArray,_QByteArray>_>::insert
                             (this->spans + sVar7,sVar8);
          pDVar4 = *(Data **)((pEVar3->storage).data + uVar9);
          (pNVar5->key).d.d = pDVar4;
          (pNVar5->key).d.ptr = *(char **)((pEVar3->storage).data + uVar9 + 8);
          (pNVar5->key).d.size = *(qsizetype *)((pEVar3->storage).data + uVar9 + 0x10);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
            ;
            UNLOCK();
          }
          pDVar4 = *(Data **)((pEVar3->storage).data + uVar9 + 0x18);
          (pNVar5->value).d.d = pDVar4;
          (pNVar5->value).d.ptr = *(char **)((pEVar3->storage).data + uVar9 + 0x20);
          (pNVar5->value).d.size = *(qsizetype *)((pEVar3->storage).data + uVar9 + 0x28);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != 0x80);
      sVar7 = sVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (sVar7 != RVar10.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }